

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O0

ssize_t __thiscall
crnlib::dynamic_stream::write(dynamic_stream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uchar *__dest;
  undefined4 in_register_00000034;
  uint new_ofs;
  uint uVar4;
  uint local_4;
  
  local_4 = (uint)__buf;
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_writable((data_stream *)0x1c4c0f), !bVar1)) || (local_4 == 0)) {
    local_4 = 0;
  }
  else {
    uVar2 = this->m_ofs + local_4;
    uVar4 = uVar2;
    uVar3 = vector<unsigned_char>::size(&this->m_buf);
    if (uVar3 < uVar2) {
      vector<unsigned_char>::resize
                ((vector<unsigned_char> *)CONCAT44(local_4,uVar4),(uint)((ulong)this >> 0x20),
                 SUB81((ulong)this >> 0x18,0));
    }
    __dest = vector<unsigned_char>::operator[](&this->m_buf,this->m_ofs);
    memcpy(__dest,(void *)CONCAT44(in_register_00000034,__fd),(ulong)local_4);
    this->m_ofs = uVar4;
  }
  return (ulong)local_4;
}

Assistant:

virtual uint write(const void* pBuf, uint len) {
    CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

    if ((!m_opened) || (!is_writable()) || (!len))
      return 0;

    CRNLIB_ASSERT(m_ofs <= m_buf.size());

    uint new_ofs = m_ofs + len;
    if (new_ofs > m_buf.size())
      m_buf.resize(new_ofs);

    memcpy(&m_buf[m_ofs], pBuf, len);
    m_ofs = new_ofs;

    return len;
  }